

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::AV1LbdInvTxfm2d_gt_int16_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::AV1LbdInvTxfm2d_gt_int16_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<void(*const)(int_const*,unsigned_char*,int,unsigned_char,unsigned_char,int)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x20);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_01050850;
  this_00[1]._vptr_Test = (_func_int **)&PTR__AV1LbdInvTxfm2d_gt_int16_Test_01050890;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }